

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int createFunctionApi(sqlite3 *db,char *zFunc,int nArg,int enc,void *p,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,_func_void_sqlite3_context_ptr *xValue,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xInverse,
                     _func_void_void_ptr *xDestroy)

{
  int iVar1;
  FuncDestructor *local_50;
  FuncDestructor *pArg;
  int rc;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc_local;
  void *p_local;
  int enc_local;
  int nArg_local;
  char *zFunc_local;
  sqlite3 *db_local;
  
  pArg._4_4_ = 1;
  local_50 = (FuncDestructor *)0x0;
  sqlite3_mutex_enter(db->mutex);
  if (xDestroy != (_func_void_void_ptr *)0x0) {
    local_50 = (FuncDestructor *)sqlite3Malloc(0x18);
    if (local_50 == (FuncDestructor *)0x0) {
      sqlite3OomFault(db);
      (*xDestroy)(p);
      goto LAB_00132196;
    }
    local_50->nRef = 0;
    local_50->xDestroy = xDestroy;
    local_50->pUserData = p;
  }
  pArg._4_4_ = sqlite3CreateFunc(db,zFunc,nArg,enc,p,xSFunc,xStep,xFinal,xValue,xInverse,local_50);
  if ((local_50 != (FuncDestructor *)0x0) && (local_50->nRef == 0)) {
    (*xDestroy)(p);
    sqlite3_free(local_50);
  }
LAB_00132196:
  iVar1 = sqlite3ApiExit(db,pArg._4_4_);
  sqlite3_mutex_leave(db->mutex);
  return iVar1;
}

Assistant:

static int createFunctionApi(
  sqlite3 *db,
  const char *zFunc,
  int nArg,
  int enc,
  void *p,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**),
  void (*xStep)(sqlite3_context*,int,sqlite3_value**),
  void (*xFinal)(sqlite3_context*),
  void (*xValue)(sqlite3_context*),
  void (*xInverse)(sqlite3_context*,int,sqlite3_value**),
  void(*xDestroy)(void*)
){
  int rc = SQLITE_ERROR;
  FuncDestructor *pArg = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( xDestroy ){
    pArg = (FuncDestructor *)sqlite3Malloc(sizeof(FuncDestructor));
    if( !pArg ){
      sqlite3OomFault(db);
      xDestroy(p);
      goto out;
    }
    pArg->nRef = 0;
    pArg->xDestroy = xDestroy;
    pArg->pUserData = p;
  }
  rc = sqlite3CreateFunc(db, zFunc, nArg, enc, p,
      xSFunc, xStep, xFinal, xValue, xInverse, pArg
  );
  if( pArg && pArg->nRef==0 ){
    assert( rc!=SQLITE_OK || (xStep==0 && xFinal==0) );
    xDestroy(p);
    sqlite3_free(pArg);
  }

 out:
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}